

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O2

ReadState __thiscall
CombinedH264Reader::detectStreamByNal(CombinedH264Reader *this,uint8_t *data,uint8_t *dataEnd)

{
  byte bVar1;
  int iVar2;
  ReadState RVar3;
  SEIUnit sei;
  
  bVar1 = *data & 0x1f;
  switch(bVar1) {
  case 6:
    sei.m_processedMessages._M_h._M_buckets = &sei.m_processedMessages._M_h._M_single_bucket;
    sei.super_NALUnit.bitReader.super_BitStream.m_totalBits = 0;
    sei.super_NALUnit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
    sei.super_NALUnit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
    sei.super_NALUnit.bitReader.m_curVal = 0;
    sei.super_NALUnit.bitReader.m_bitLeft = 0;
    sei.super_NALUnit.nal_unit_type = nuUnspecified;
    sei.super_NALUnit.nal_ref_idc = 0;
    sei.super_NALUnit.m_nalBuffer = (uint8_t *)0x0;
    sei.super_NALUnit.m_nalBufferLen = 0;
    sei.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__SEIUnit_0024a4f0;
    sei._64_8_ = sei._64_8_ & 0xffffffffffffff00;
    sei.m_processedMessages._M_h._M_bucket_count = 1;
    sei.m_processedMessages._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    sei.m_processedMessages._M_h._M_element_count = 0;
    sei.m_processedMessages._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    memset(&sei.m_processedMessages._M_h._M_rehash_policy._M_next_resize,0,0x118);
    sei.number_of_offset_sequences = -1;
    sei.metadataPtsOffset = 0;
    sei.m_mvcHeaderLen = 0;
    sei.m_mvcHeaderStart = (uint8_t *)0x0;
    NALUnit::decodeBuffer(&sei.super_NALUnit,data,dataEnd);
    iVar2 = SEIUnit::isMVCSEI(&sei);
    RVar3 = NeedMoreData;
    if (iVar2 != -10) {
      RVar3 = Secondary - (iVar2 == 0);
    }
    SEIUnit::~SEIUnit(&sei);
    break;
  case 8:
    sei.super_NALUnit.bitReader.super_BitStream.m_totalBits = 0;
    sei.super_NALUnit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
    sei.super_NALUnit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
    sei.super_NALUnit.bitReader.m_curVal = 0;
    sei.super_NALUnit.bitReader.m_bitLeft = 0;
    sei.super_NALUnit.nal_unit_type = nuUnspecified;
    sei.super_NALUnit.nal_ref_idc = 0;
    sei.super_NALUnit.m_nalBuffer = (uint8_t *)0x0;
    sei.super_NALUnit.m_nalBufferLen = 0;
    sei.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__NALUnit_0024a4a0;
    sei.pic_struct = '\0';
    sei._65_7_ = 0;
    sei.m_processedMessages._M_h._M_buckets = (__buckets_ptr)0x100000001;
    sei.m_processedMessages._M_h._M_bucket_count =
         sei.m_processedMessages._M_h._M_bucket_count & 0xffffffffffffff00;
    NALUnit::decodeBuffer(&sei.super_NALUnit,data,dataEnd);
    iVar2 = PPSUnit::deserialize((PPSUnit *)&sei);
    RVar3 = NeedMoreData;
    if (iVar2 != -10) {
      RVar3 = (sei._68_4_ == this->m_mvcSPS) + Primary;
    }
    NALUnit::~NALUnit(&sei.super_NALUnit);
    break;
  case 10:
    RVar3 = Both;
    break;
  case 0xf:
    SPSUnit::SPSUnit((SPSUnit *)&sei);
    NALUnit::decodeBuffer(&sei.super_NALUnit,data,dataEnd);
    iVar2 = SPSUnit::deserialize((SPSUnit *)&sei);
    RVar3 = NeedMoreData;
    if (iVar2 != -10) {
      this->m_mvcSPS = sei.initial_cpb_removal_delay[6];
      RVar3 = Secondary;
    }
    SPSUnit::~SPSUnit((SPSUnit *)&sei);
    break;
  default:
    if ((bVar1 == 0x18) || (bVar1 == 0x14)) {
      return Secondary;
    }
  case 7:
  case 9:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    RVar3 = Primary;
  }
  return RVar3;
}

Assistant:

CombinedH264Reader::ReadState CombinedH264Reader::detectStreamByNal(const uint8_t* data, const uint8_t* dataEnd)
{
    const auto nalType = static_cast<NALUnit::NALType>(*data & 0x1f);

    switch (nalType)
    {
    case NALUnit::NALType::nuEOSeq:
        return ReadState::Both;
    case NALUnit::NALType::nuDRD:
    case NALUnit::NALType::nuSliceExt:
        return ReadState::Secondary;

    case NALUnit::NALType::nuSubSPS:
    {
        SPSUnit sps;
        sps.decodeBuffer(data, dataEnd);
        if (sps.deserialize() == NOT_ENOUGH_BUFFER)
            return ReadState::NeedMoreData;
        m_mvcSPS = sps.seq_parameter_set_id;
        return ReadState::Secondary;
    }
    case NALUnit::NALType::nuPPS:
    {
        PPSUnit pps;
        pps.decodeBuffer(data, dataEnd);
        if (pps.deserialize() == NOT_ENOUGH_BUFFER)
            return ReadState::NeedMoreData;
        if (pps.seq_parameter_set_id == m_mvcSPS)
            return ReadState::Secondary;
        return ReadState::Primary;
    }
    case NALUnit::NALType::nuSEI:
    {
        SEIUnit sei;
        sei.decodeBuffer(data, dataEnd);
        const int rez = sei.isMVCSEI();
        if (rez == NOT_ENOUGH_BUFFER)
            return ReadState::NeedMoreData;
        if (rez == 0)
            return ReadState::Primary;
        return ReadState::Secondary;
    }
    default:
        return ReadState::Primary;
    }
}